

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::BitwiseNotFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalTypeId LVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this_00;
  ScalarFunction *function;
  pointer function_00;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb7c;
  FunctionNullHandling in_stack_fffffffffffffb88;
  allocator_type local_472;
  allocator local_471;
  code *in_stack_fffffffffffffb90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_438;
  scalar_function_t local_420;
  LogicalType local_400;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d0;
  _Any_data local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  LogicalType local_390;
  LogicalType local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Integral();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  other = local_438.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (other == local_438.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_438);
      LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffb90,BIT);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&stack0xfffffffffffffb90;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3e8,__l_00,(allocator_type *)&local_438);
      LogicalType::LogicalType(&local_400,BIT);
      local_420.super__Function_base._M_functor._8_8_ = 0;
      local_420.super__Function_base._M_functor._M_unused._M_object = BitwiseNOTOperation;
      local_420._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_420.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_390,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_390;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffb74;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffb7c;
      ScalarFunction::ScalarFunction
                (&local_330,(vector<duckdb::LogicalType,_true> *)&local_3e8,&local_400,&local_420,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                 in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_330);
      ScalarFunction::~ScalarFunction(&local_330);
      LogicalType::~LogicalType(&local_390);
      ::std::_Function_base::~_Function_base(&local_420.super__Function_base);
      LogicalType::~LogicalType(&local_400);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e8);
      LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffb90);
      pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
               super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                         super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         .
                         super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start; function_00 != pSVar2;
          function_00 = function_00 + 1) {
        BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction(&local_e0);
      }
      return in_RDI;
    }
    LogicalType::LogicalType(&local_378,other);
    __l._M_len = 1;
    __l._M_array = &local_378;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_3d0,__l,&local_472);
    LogicalType::LogicalType(&local_348,other);
    local_3a8 = 0;
    uStack_3a0 = 0;
    local_3b8._M_unused._M_object = (void *)0x0;
    local_3b8._8_8_ = 0;
    LVar1 = other->id_;
    switch(LVar1) {
    case TINYINT:
      in_stack_fffffffffffffb90 =
           ScalarFunction::UnaryFunction<signed_char,signed_char,duckdb::BitwiseNotOperator>;
      break;
    case SMALLINT:
      in_stack_fffffffffffffb90 =
           ScalarFunction::UnaryFunction<short,short,duckdb::BitwiseNotOperator>;
      break;
    case INTEGER:
      in_stack_fffffffffffffb90 = ScalarFunction::UnaryFunction<int,int,duckdb::BitwiseNotOperator>;
      break;
    case BIGINT:
      in_stack_fffffffffffffb90 =
           ScalarFunction::UnaryFunction<long,long,duckdb::BitwiseNotOperator>;
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        in_stack_fffffffffffffb90 =
             ScalarFunction::UnaryFunction<unsigned_char,unsigned_char,duckdb::BitwiseNotOperator>;
        break;
      case USMALLINT:
        in_stack_fffffffffffffb90 =
             ScalarFunction::UnaryFunction<unsigned_short,unsigned_short,duckdb::BitwiseNotOperator>
        ;
        break;
      case UINTEGER:
        in_stack_fffffffffffffb90 =
             ScalarFunction::UnaryFunction<unsigned_int,unsigned_int,duckdb::BitwiseNotOperator>;
        break;
      case UBIGINT:
        in_stack_fffffffffffffb90 =
             ScalarFunction::UnaryFunction<unsigned_long,unsigned_long,duckdb::BitwiseNotOperator>;
        break;
      default:
        if (LVar1 == UHUGEINT) {
          in_stack_fffffffffffffb90 =
               ScalarFunction::
               UnaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseNotOperator>;
        }
        else {
          if (LVar1 != HUGEINT) {
            this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffb90,
                       "Unimplemented type for GetScalarIntegerUnaryFunction",&local_471);
            NotImplementedException::NotImplementedException
                      (this_00,(string *)&stack0xfffffffffffffb90);
            __cxa_throw(this_00,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          in_stack_fffffffffffffb90 =
               ScalarFunction::
               UnaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseNotOperator>;
        }
      }
    }
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_3b8._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&stack0xfffffffffffffb90)
    ;
    LogicalType::LogicalType(&local_360,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_360;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffb74;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffb7c;
    ScalarFunction::ScalarFunction
              (&local_208,(vector<duckdb::LogicalType,_true> *)&local_3d0,&local_348,
               (scalar_function_t *)&local_3b8,(bind_scalar_function_t)0x0,
               (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffb88,
               in_stack_fffffffffffffb90);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_208);
    ScalarFunction::~ScalarFunction(&local_208);
    LogicalType::~LogicalType(&local_360);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
    LogicalType::~LogicalType(&local_348);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d0);
    LogicalType::~LogicalType(&local_378);
    other = other + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet BitwiseNotFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(ScalarFunction({type}, type, GetScalarIntegerUnaryFunction<BitwiseNotOperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIT, BitwiseNOTOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}